

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_padlock.c
# Opt level: O0

int padlock_aes_init_key(EVP_CIPHER_CTX *ctx,uchar *key,uchar *iv,int enc)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  void *pvVar5;
  int in_ECX;
  uint uVar6;
  uchar *in_RSI;
  EVP_CIPHER_CTX *in_RDI;
  unsigned_long mode;
  int key_len;
  padlock_cipher_data *cdata;
  int local_4;
  
  iVar1 = EVP_CIPHER_CTX_get_key_length((EVP_CIPHER_CTX *)key);
  iVar1 = iVar1 * 8;
  EVP_CIPHER_CTX_get0_cipher(in_RDI);
  iVar2 = EVP_CIPHER_get_mode((EVP_CIPHER *)0x2e5eba);
  if (in_RSI == (uchar *)0x0) {
    local_4 = 0;
  }
  else {
    pvVar4 = EVP_CIPHER_CTX_get_cipher_data(in_RDI);
    pvVar5 = EVP_CIPHER_CTX_get_cipher_data(in_RDI);
    pvVar4 = (void *)((long)pvVar4 + (0x10 - ((ulong)pvVar5 & 0xf) & 0xf));
    memset(pvVar4,0,0x114);
    if ((iVar2 == 4) || (iVar2 == 5)) {
      *(ushort *)((long)pvVar4 + 0x10) = *(ushort *)((long)pvVar4 + 0x10) & 0xfdff;
    }
    else {
      iVar3 = EVP_CIPHER_CTX_is_encrypting(in_RDI);
      *(ushort *)((long)pvVar4 + 0x10) =
           *(ushort *)((long)pvVar4 + 0x10) & 0xfdff | (ushort)(iVar3 == 0) << 9;
    }
    uVar6 = iVar1 - 0x80U;
    if ((int)(iVar1 - 0x80U) < 0) {
      uVar6 = iVar1 - 0x61;
    }
    *(ushort *)((long)pvVar4 + 0x10) =
         (ushort)*(undefined4 *)((long)pvVar4 + 0x10) & 0xfff0 | (short)(uVar6 >> 5) + 10U & 0xf;
    uVar6 = iVar1 - 0x80U;
    if ((int)(iVar1 - 0x80U) < 0) {
      uVar6 = iVar1 - 0x41;
    }
    *(ushort *)((long)pvVar4 + 0x10) =
         (ushort)*(undefined4 *)((long)pvVar4 + 0x10) & 0xf3ff | (ushort)((uVar6 & 0xc0) << 4);
    if (iVar1 == 0x80) {
      *(undefined8 *)((long)pvVar4 + 0x20) = *(undefined8 *)in_RSI;
      *(undefined8 *)((long)pvVar4 + 0x28) = *(undefined8 *)(in_RSI + 8);
      *(ushort *)((long)pvVar4 + 0x10) = *(ushort *)((long)pvVar4 + 0x10) & 0xff7f;
    }
    else {
      if ((iVar1 != 0xc0) && (iVar1 != 0x100)) {
        return 0;
      }
      if (((iVar2 == 1) || (iVar2 == 2)) && (in_ECX == 0)) {
        AES_set_decrypt_key(in_RSI,iVar1,(AES_KEY *)((long)pvVar4 + 0x20));
      }
      else {
        AES_set_encrypt_key(in_RSI,iVar1,(AES_KEY *)((long)pvVar4 + 0x20));
      }
      *(ushort *)((long)pvVar4 + 0x10) = *(ushort *)((long)pvVar4 + 0x10) & 0xff7f | 0x80;
    }
    padlock_reload_key();
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int
padlock_aes_init_key(EVP_CIPHER_CTX *ctx, const unsigned char *key,
                     const unsigned char *iv, int enc)
{
    struct padlock_cipher_data *cdata;
    int key_len = EVP_CIPHER_CTX_get_key_length(ctx) * 8;
    unsigned long mode = EVP_CIPHER_CTX_get_mode(ctx);

    if (key == NULL)
        return 0;               /* ERROR */

    cdata = ALIGNED_CIPHER_DATA(ctx);
    memset(cdata, 0, sizeof(*cdata));

    /* Prepare Control word. */
    if (mode == EVP_CIPH_OFB_MODE || mode == EVP_CIPH_CTR_MODE)
        cdata->cword.b.encdec = 0;
    else
        cdata->cword.b.encdec = (EVP_CIPHER_CTX_is_encrypting(ctx) == 0);
    cdata->cword.b.rounds = 10 + (key_len - 128) / 32;
    cdata->cword.b.ksize = (key_len - 128) / 64;

    switch (key_len) {
    case 128:
        /*
         * PadLock can generate an extended key for AES128 in hardware
         */
        memcpy(cdata->ks.rd_key, key, AES_KEY_SIZE_128);
        cdata->cword.b.keygen = 0;
        break;

    case 192:
    case 256:
        /*
         * Generate an extended AES key in software. Needed for AES192/AES256
         */
        /*
         * Well, the above applies to Stepping 8 CPUs and is listed as
         * hardware errata. They most likely will fix it at some point and
         * then a check for stepping would be due here.
         */
        if ((mode == EVP_CIPH_ECB_MODE || mode == EVP_CIPH_CBC_MODE)
            && !enc)
            AES_set_decrypt_key(key, key_len, &cdata->ks);
        else
            AES_set_encrypt_key(key, key_len, &cdata->ks);
#  ifndef AES_ASM
        /*
         * OpenSSL C functions use byte-swapped extended key.
         */
        padlock_key_bswap(&cdata->ks);
#  endif
        cdata->cword.b.keygen = 1;
        break;

    default:
        /* ERROR */
        return 0;
    }

    /*
     * This is done to cover for cases when user reuses the
     * context for new key. The catch is that if we don't do
     * this, padlock_eas_cipher might proceed with old key...
     */
    padlock_reload_key();

    return 1;
}